

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

container_t *
convert_to_bitset_or_array_container(run_container_t *rc,int32_t card,uint8_t *resulttype)

{
  ushort uVar1;
  undefined1 *in_RDX;
  int in_ESI;
  int *in_RDI;
  uint16_t run_start_1;
  int rlepos_1;
  bitset_container_t *answer;
  uint16_t run_value;
  uint16_t run_end;
  uint16_t run_start;
  int rlepos;
  array_container_t *answer_1;
  int32_t in_stack_ffffffffffffffbc;
  int iVar2;
  ushort local_32;
  int local_2c;
  array_container_t *local_8;
  
  if (in_ESI < 0x1001) {
    local_8 = array_container_create_given_capacity(in_stack_ffffffffffffffbc);
    local_8->cardinality = 0;
    for (local_2c = 0; local_2c < *in_RDI; local_2c = local_2c + 1) {
      local_32 = *(ushort *)(*(long *)(in_RDI + 2) + (long)local_2c * 4);
      uVar1 = local_32 + *(short *)(*(long *)(in_RDI + 2) + 2 + (long)local_2c * 4);
      for (; local_32 < uVar1; local_32 = local_32 + 1) {
        iVar2 = local_8->cardinality;
        local_8->cardinality = iVar2 + 1;
        local_8->array[iVar2] = local_32;
      }
      iVar2 = local_8->cardinality;
      local_8->cardinality = iVar2 + 1;
      local_8->array[iVar2] = uVar1;
    }
    *in_RDX = 2;
  }
  else {
    local_8 = (array_container_t *)bitset_container_create();
    for (iVar2 = 0; iVar2 < *in_RDI; iVar2 = iVar2 + 1) {
      bitset_set_lenrange((uint64_t *)local_8->array,
                          (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)iVar2 * 4),
                          (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)iVar2 * 4));
    }
    local_8->cardinality = in_ESI;
    *in_RDX = 1;
  }
  return local_8;
}

Assistant:

container_t *convert_to_bitset_or_array_container(run_container_t *rc,
                                                  int32_t card,
                                                  uint8_t *resulttype) {
    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
            uint16_t run_start = rc->runs[rlepos].value;
            uint16_t run_end = run_start + rc->runs[rlepos].length;
            for (uint16_t run_value = run_start; run_value < run_end;
                 ++run_value) {
                answer->array[answer->cardinality++] = run_value;
            }
            answer->array[answer->cardinality++] = run_end;
        }
        assert(card == answer->cardinality);
        *resulttype = ARRAY_CONTAINER_TYPE;
        // run_container_free(r);
        return answer;
    }
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
        uint16_t run_start = rc->runs[rlepos].value;
        bitset_set_lenrange(answer->words, run_start, rc->runs[rlepos].length);
    }
    answer->cardinality = card;
    *resulttype = BITSET_CONTAINER_TYPE;
    // run_container_free(r);
    return answer;
}